

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int MRIStepEvolve(void *arkode_mem,realtype tout,N_Vector yout,realtype *tret,int itask)

{
  int *nflagPtr;
  int iVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  realtype rVar9;
  double dVar10;
  undefined8 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int iStack_54;
  realtype rStack_50;
  realtype rStack_48;
  int aiStack_40 [4];
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","MRIStepEvolve",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    pcVar7 = "arkode_mem = NULL illegal.";
    iVar3 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    iVar5 = -0x15;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x250) == 0) {
      pcVar7 = "Attempt to call before ARKodeInit.";
      iVar3 = -0x17;
      iVar5 = -0x17;
      goto LAB_003eb764;
    }
    *(N_Vector *)((long)arkode_mem + 0x108) = yout;
    if (yout == (N_Vector)0x0) {
      pcVar7 = "yout = NULL illegal.";
    }
    else if (tret == (realtype *)0x0) {
      pcVar7 = "tret = NULL illegal.";
    }
    else {
      if (0xfffffffd < itask - 3U) {
        lVar8 = *(long *)((long)arkode_mem + 0x280);
        if (lVar8 != 0) {
          if (itask == 1) {
            *(realtype *)(lVar8 + 0x50) = tout;
          }
          *(int *)(lVar8 + 0x60) = itask;
        }
        iVar3 = iStack_54;
        rStack_50 = tout;
        if (*(int *)((long)arkode_mem + 0x254) != 0) {
          rVar9 = *(realtype *)((long)arkode_mem + 0x198);
          *tret = rVar9;
          *(realtype *)((long)arkode_mem + 0x1a0) = rVar9;
          iVar3 = arkInitialSetup((ARKodeMem)arkode_mem,tout);
          if (iVar3 != 0) {
            return iVar3;
          }
          iStack_54 = 0;
          iVar3 = 0;
          if (*(int *)((long)arkode_mem + 0x254) != 0) goto LAB_003eb80b;
        }
        iStack_54 = iVar3;
        iVar3 = arkStopTests((ARKodeMem)arkode_mem,rStack_50,yout,tret,itask,&iStack_54);
        if (iVar3 != 0) {
          return iStack_54;
        }
LAB_003eb80b:
        nflagPtr = aiStack_40 + 3;
        lVar8 = 0;
        do {
          *(undefined8 *)((long)arkode_mem + 0x188) = *(undefined8 *)((long)arkode_mem + 0x168);
          if (*(int *)((long)arkode_mem + 0x254) == 0) {
            iVar3 = (**(code **)((long)arkode_mem + 0x58))
                              (*(undefined8 *)((long)arkode_mem + 0x110),
                               *(undefined8 *)((long)arkode_mem + 0xf0),
                               *(undefined8 *)((long)arkode_mem + 0x60));
            if (iVar3 == 0) {
              if ((*(int *)((long)arkode_mem + 0x100) != 0) ||
                 (iVar3 = (**(code **)((long)arkode_mem + 0x70))
                                    (*(undefined8 *)((long)arkode_mem + 0x110),
                                     *(undefined8 *)((long)arkode_mem + 0xf8),
                                     *(undefined8 *)((long)arkode_mem + 0x78)), iVar3 == 0))
              goto LAB_003eb86f;
              iVar3 = *(int *)((long)arkode_mem + 0x18);
              uVar11 = *(undefined8 *)((long)arkode_mem + 0x198);
              pcVar4 = "At t = %lg, the user-provide RwtSet function failed.";
              pcVar7 = "At t = %lg, a component of rwt has become <= 0.";
            }
            else {
              iVar3 = *(int *)((long)arkode_mem + 0x18);
              uVar11 = *(undefined8 *)((long)arkode_mem + 0x198);
              pcVar4 = "At t = %lg, the user-provide EwtSet function failed.";
              pcVar7 = "At t = %lg, a component of ewt has become <= 0.";
            }
            if (iVar3 == 2) {
              pcVar7 = pcVar4;
            }
            iVar3 = -0x16;
            iVar5 = -0x16;
LAB_003ebf70:
            arkProcessError((ARKodeMem)arkode_mem,iVar5,"ARKode","arkEvolve",pcVar7,uVar11);
LAB_003ebd69:
            rVar9 = *(realtype *)((long)arkode_mem + 0x198);
            *tret = rVar9;
            *(realtype *)((long)arkode_mem + 0x1a0) = rVar9;
            N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),yout);
            return iVar3;
          }
LAB_003eb86f:
          if (*(long *)((long)arkode_mem + 0x1b8) <= lVar8 &&
              0 < *(long *)((long)arkode_mem + 0x1b8)) {
            uVar11 = *(undefined8 *)((long)arkode_mem + 0x198);
            pcVar7 = "At t = %lg, mxstep steps taken before reaching tout.";
            iVar3 = -1;
            iVar5 = -1;
            goto LAB_003ebf70;
          }
          rVar9 = N_VWrmsNorm(*(N_Vector *)((long)arkode_mem + 0x110),
                              *(N_Vector *)((long)arkode_mem + 0xf0));
          dVar10 = rVar9 * *(double *)((long)arkode_mem + 8);
          *(double *)((long)arkode_mem + 0x240) = dVar10;
          if (1.0 < dVar10) {
            arkProcessError((ARKodeMem)arkode_mem,-2,"ARKode","arkEvolve",
                            "At t = %lg, too much accuracy requested.",
                            *(undefined8 *)((long)arkode_mem + 0x198));
            rVar9 = *(realtype *)((long)arkode_mem + 0x198);
            *tret = rVar9;
            *(realtype *)((long)arkode_mem + 0x1a0) = rVar9;
            N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),yout);
            *(double *)((long)arkode_mem + 0x240) =
                 *(double *)((long)arkode_mem + 0x240) + *(double *)((long)arkode_mem + 0x240);
            return -2;
          }
          *(undefined8 *)((long)arkode_mem + 0x240) = 0x3ff0000000000000;
          dVar10 = *(double *)((long)arkode_mem + 0x198);
          dVar12 = dVar10 + *(double *)((long)arkode_mem + 0x168);
          if ((dVar12 == dVar10) && (!NAN(dVar12) && !NAN(dVar10))) {
            iVar5 = *(int *)((long)arkode_mem + 0x1c0);
            iVar1 = *(int *)((long)arkode_mem + 0x1e0);
            iVar3 = iVar1 + 1;
            *(int *)((long)arkode_mem + 0x1e0) = iVar3;
            if (iVar1 < iVar5) {
              arkProcessError((ARKodeMem)arkode_mem,99,"ARKode","arkEvolve",
                              "Internal t = %lg and h = %lg are such that t + h = t on the next step. The solver will continue anyway."
                             );
              iVar5 = *(int *)((long)arkode_mem + 0x1c0);
              iVar3 = *(int *)((long)arkode_mem + 0x1e0);
            }
            if (iVar3 == iVar5) {
              arkProcessError((ARKodeMem)arkode_mem,99,"ARKode","arkEvolve",
                              "The above warning has been issued mxhnil times and will not be issued again for this problem."
                             );
            }
          }
          dVar10 = *(double *)((long)arkode_mem + 0x168);
          if ((*(double *)((long)arkode_mem + 0x180) != dVar10) ||
             (NAN(*(double *)((long)arkode_mem + 0x180)) || NAN(dVar10))) {
            dVar10 = dVar10 * *(double *)((long)arkode_mem + 400);
            *(double *)((long)arkode_mem + 0x168) = dVar10;
            *(double *)((long)arkode_mem + 0x188) = dVar10;
          }
          if (*(int *)((long)arkode_mem + 0x1a8) != 0) {
            dVar10 = *(double *)((long)arkode_mem + 0x160);
            *(double *)((long)arkode_mem + 0x168) = dVar10;
            *(double *)((long)arkode_mem + 0x188) = dVar10;
            if (*(int *)((long)arkode_mem + 0x150) != 0) {
              if (0.0 < ((dVar10 + *(double *)((long)arkode_mem + 0x198)) -
                        *(double *)((long)arkode_mem + 0x158)) * dVar10) {
                *(double *)((long)arkode_mem + 0x168) =
                     (*(double *)((long)arkode_mem + 8) * -4.0 + 1.0) *
                     (*(double *)((long)arkode_mem + 0x158) - *(double *)((long)arkode_mem + 0x198))
                ;
              }
            }
          }
          rStack_48 = 0.0;
          *(undefined4 *)((long)arkode_mem + 0x2a4) = 0;
          aiStack_40[0] = 0;
          aiStack_40[1] = 0;
          aiStack_40[2] = 0;
          aiStack_40[3] = 6;
          while( true ) {
            *(long *)((long)arkode_mem + 0x1d0) = *(long *)((long)arkode_mem + 0x1d0) + 1;
            iVar3 = (**(code **)((long)arkode_mem + 0xe0))(arkode_mem,&rStack_48,nflagPtr);
            if (iVar3 < 0) goto LAB_003ebd5d;
            iVar3 = arkCheckConvergence((ARKodeMem)arkode_mem,nflagPtr,aiStack_40 + 2);
            if ((iVar3 < 0) ||
               (((iVar3 == 0 && (*(int *)((long)arkode_mem + 0x80) != 0)) &&
                (iVar3 = arkCheckConstraints((ARKodeMem)arkode_mem,aiStack_40,nflagPtr), iVar3 < 0))
               )) goto LAB_003ebd5d;
            if (*(int *)((long)arkode_mem + 0x1a8) != 0) break;
            if ((iVar3 == 0) &&
               (iVar3 = arkCheckTemporalError
                                  ((ARKodeMem)arkode_mem,nflagPtr,aiStack_40 + 1,rStack_48),
               iVar3 < 0)) goto LAB_003ebd5d;
            dVar10 = *(double *)((long)arkode_mem + 400);
            if (**(double **)((long)arkode_mem + 0x1b0) <= *(double *)((long)arkode_mem + 400)) {
              dVar10 = **(double **)((long)arkode_mem + 0x1b0);
            }
            dVar12 = ABS(*(double *)((long)arkode_mem + 0x168));
            dVar13 = *(double *)((long)arkode_mem + 0x170) / dVar12;
            if (dVar10 <= dVar13) {
              dVar10 = dVar13;
            }
            dVar14 = *(double *)((long)arkode_mem + 0x178) * dVar12 * dVar10;
            dVar13 = 1.0;
            if (1.0 <= dVar14) {
              dVar13 = dVar14;
            }
            *(double *)((long)arkode_mem + 400) = dVar10 / dVar13;
            if (*(int *)((long)arkode_mem + 0x2a0) != 0) {
              *(int *)((long)arkode_mem + 0x2a4) = iVar3;
              goto LAB_003ebb75;
            }
            if (iVar3 == 0) goto LAB_003ebb75;
            if (dVar12 <= *(double *)((long)arkode_mem + 0x170) * 1.000001) {
              return -3;
            }
            dVar10 = *(double *)((long)arkode_mem + 0x168) * (dVar10 / dVar13);
            *(double *)((long)arkode_mem + 0x168) = dVar10;
            *(double *)((long)arkode_mem + 0x180) = dVar10;
            *(double *)((long)arkode_mem + 0x188) = dVar10;
          }
          *(undefined8 *)((long)arkode_mem + 400) = 0x3ff0000000000000;
          if (iVar3 != 0) goto LAB_003ebd5d;
LAB_003ebb75:
          iVar3 = arkCompleteStep((ARKodeMem)arkode_mem,rStack_48);
          if (iVar3 != 0) {
LAB_003ebd5d:
            iVar3 = arkHandleFailure((ARKodeMem)arkode_mem,iVar3);
            goto LAB_003ebd69;
          }
          if ((*(long *)((long)arkode_mem + 0x280) != 0) &&
             (0 < *(int *)(*(long *)((long)arkode_mem + 0x280) + 8))) {
            iVar3 = arkRootCheck3(arkode_mem);
            if (iVar3 == -0xc) {
              arkProcessError((ARKodeMem)arkode_mem,-0xc,"ARKode","arkEvolve",
                              "At t = %lg, the rootfinding routine failed in an unrecoverable manner."
                              ,*(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x20));
              return -0xc;
            }
            if (iVar3 == 1) {
              lVar8 = *(long *)((long)arkode_mem + 0x280);
              *(undefined4 *)(lVar8 + 100) = 1;
              rVar9 = *(realtype *)(lVar8 + 0x20);
              *tret = rVar9;
              *(realtype *)((long)arkode_mem + 0x1a0) = rVar9;
              return 2;
            }
            if (*(long *)((long)arkode_mem + 0x1d8) == 1) {
              lVar2 = *(long *)((long)arkode_mem + 0x280);
              if (0 < (long)*(int *)(lVar2 + 8)) {
                lVar6 = 0;
                do {
                  if (*(int *)(*(long *)(lVar2 + 0x70) + lVar6 * 4) == 0) {
                    if (0 < *(int *)(lVar2 + 0x78)) {
                      arkProcessError((ARKodeMem)arkode_mem,99,"ARKode","arkEvolve",
                                      "At the end of the first step, there are still some root functions identically 0. This warning will not be issued again."
                                     );
                    }
                    break;
                  }
                  lVar6 = lVar6 + 1;
                } while (*(int *)(lVar2 + 8) != lVar6);
              }
            }
          }
          if ((itask == 1) &&
             (0.0 <= (*(double *)((long)arkode_mem + 0x198) - rStack_50) *
                     *(double *)((long)arkode_mem + 0x168))) {
            *tret = rStack_50;
            *(realtype *)((long)arkode_mem + 0x1a0) = rStack_50;
            arkGetDky((ARKodeMem)arkode_mem,rStack_50,0,yout);
            *(undefined8 *)((long)arkode_mem + 0x188) = *(undefined8 *)((long)arkode_mem + 0x180);
            return 0;
          }
          if (*(int *)((long)arkode_mem + 0x150) != 0) {
            dVar10 = *(double *)((long)arkode_mem + 0x158);
            dVar12 = *(double *)((long)arkode_mem + 0x198);
            dVar13 = *(double *)((long)arkode_mem + 0x168);
            if (ABS(dVar12 - dVar10) <=
                (ABS(dVar13) + ABS(dVar12)) * *(double *)((long)arkode_mem + 8) * 100.0) {
              arkGetDky((ARKodeMem)arkode_mem,dVar10,0,yout);
              rVar9 = *(realtype *)((long)arkode_mem + 0x158);
              *tret = rVar9;
              *(realtype *)((long)arkode_mem + 0x1a0) = rVar9;
              *(undefined4 *)((long)arkode_mem + 0x150) = 0;
              return 1;
            }
            if (0.0 < ((*(double *)((long)arkode_mem + 0x180) + dVar12) - dVar10) * dVar13) {
              dVar10 = (*(double *)((long)arkode_mem + 8) * -4.0 + 1.0) * (dVar10 - dVar12);
              *(double *)((long)arkode_mem + 0x180) = dVar10;
              *(double *)((long)arkode_mem + 400) = dVar10 / dVar13;
            }
          }
          lVar8 = lVar8 + 1;
          if (itask == 2) {
            rVar9 = *(realtype *)((long)arkode_mem + 0x198);
            *tret = rVar9;
            *(realtype *)((long)arkode_mem + 0x1a0) = rVar9;
            N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),yout);
            *(undefined8 *)((long)arkode_mem + 0x188) = *(undefined8 *)((long)arkode_mem + 0x180);
            return 0;
          }
        } while( true );
      }
      pcVar7 = "Illegal value for itask.";
    }
    iVar3 = -0x16;
    iVar5 = -0x16;
  }
LAB_003eb764:
  arkProcessError((ARKodeMem)arkode_mem,iVar5,"ARKode","arkEvolve",pcVar7);
  return iVar3;
}

Assistant:

int MRIStepEvolve(void *arkode_mem, realtype tout, N_Vector yout,
                  realtype *tret, int itask)
{
  /* unpack ark_mem, call arkEvolve, and return */
  int retval;
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepEvolve", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  SUNDIALS_MARK_FUNCTION_BEGIN(ARK_PROFILER);
  retval = arkEvolve(ark_mem, tout, yout, tret, itask);
  SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
  return(retval);
}